

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::splitTracks(MidiFile *this)

{
  MidiEventList *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  reference ppMVar4;
  MidiEvent *pMVar5;
  MidiEventList *pMVar6;
  int trackValue;
  MidiEventList *olddata;
  int m_trackCount;
  int length;
  int i;
  int maxTrack;
  int oldTimeState;
  MidiFile *this_local;
  
  iVar1 = getTrackState(this);
  if (iVar1 != 0) {
    iVar1 = getTickState(this);
    if (iVar1 == 0) {
      makeAbsoluteTicks(this);
    }
    length = 0;
    ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,0);
    iVar2 = MidiEventList::size(*ppMVar4);
    for (m_trackCount = 0; m_trackCount < iVar2; m_trackCount = m_trackCount + 1) {
      ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,0);
      pMVar5 = MidiEventList::operator[](*ppMVar4,m_trackCount);
      if (length < pMVar5->track) {
        ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                  operator[](&this->m_events,0);
        pMVar5 = MidiEventList::operator[](*ppMVar4,m_trackCount);
        length = pMVar5->track;
      }
    }
    iVar3 = length + 1;
    if (1 < iVar3) {
      ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,0);
      this_00 = *ppMVar4;
      ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,0);
      *ppMVar4 = (value_type)0x0;
      std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
                (&this->m_events,(long)iVar3);
      for (m_trackCount = 0; m_trackCount < iVar3; m_trackCount = m_trackCount + 1) {
        pMVar6 = (MidiEventList *)operator_new(0x18);
        MidiEventList::MidiEventList(pMVar6);
        ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                  operator[](&this->m_events,(long)m_trackCount);
        *ppMVar4 = pMVar6;
      }
      for (m_trackCount = 0; m_trackCount < iVar2; m_trackCount = m_trackCount + 1) {
        pMVar5 = MidiEventList::operator[](this_00,m_trackCount);
        ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                  operator[](&this->m_events,(long)pMVar5->track);
        pMVar6 = *ppMVar4;
        pMVar5 = MidiEventList::operator[](this_00,m_trackCount);
        MidiEventList::push_back_no_copy(pMVar6,pMVar5);
      }
      MidiEventList::detach(this_00);
      if (this_00 != (MidiEventList *)0x0) {
        MidiEventList::~MidiEventList(this_00);
        operator_delete(this_00);
      }
      if (iVar1 == 0) {
        makeDeltaTicks(this);
      }
      this->m_theTrackState = 0;
    }
  }
  return;
}

Assistant:

void MidiFile::splitTracks(void) {
	if (getTrackState() == TRACK_STATE_SPLIT) {
		return;
	}
	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeAbsoluteTicks();
	}

	int maxTrack = 0;
	int i;
	int length = m_events[0]->size();
	for (i=0; i<length; i++) {
		if ((*m_events[0])[i].track > maxTrack) {
			maxTrack = (*m_events[0])[i].track;
		}
	}
	int m_trackCount = maxTrack + 1;

	if (m_trackCount <= 1) {
		return;
	}

	MidiEventList* olddata = m_events[0];
	m_events[0] = NULL;
	m_events.resize(m_trackCount);
	for (i=0; i<m_trackCount; i++) {
		m_events[i] = new MidiEventList;
	}

	for (i=0; i<length; i++) {
		int trackValue = (*olddata)[i].track;
		m_events[trackValue]->push_back_no_copy(&(*olddata)[i]);
	}

	olddata->detach();
	delete olddata;

	if (oldTimeState == TIME_STATE_DELTA) {
		makeDeltaTicks();
	}

	m_theTrackState = TRACK_STATE_SPLIT;
}